

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<unsigned_char,char,1>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *t,char *u,uchar *result)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = *u;
  if (bVar1 == 0) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  bVar2 = *t;
  if (bVar2 != 0) {
    if ('\0' < (char)bVar1) {
      bVar2 = bVar2 / bVar1;
      goto LAB_0010b94e;
    }
    if (-1 < (char)bVar1) {
      __assert_fail("t < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                    ,0x2ce,"static std::uint32_t AbsValueHelper<char, 0>::Abs(T) [T = char]");
    }
    if ((byte)-bVar1 <= bVar2) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  bVar2 = 0;
LAB_0010b94e:
  *result = bVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }